

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O2

uint32_t __thiscall Instance::makespan(Instance *this)

{
  Train *pTVar1;
  pointer ppEVar2;
  Edge *pEVar3;
  Z3_lbool ZVar4;
  uint uVar5;
  ulong uVar6;
  Train *pTVar7;
  pointer ppEVar8;
  bool bVar9;
  model m;
  Train train;
  uint local_e8;
  model local_b0;
  ast local_a0;
  ast local_90;
  Train local_80;
  
  z3::optimize::get_model((optimize *)&local_b0);
  pTVar1 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar7 = (this->trains).super__Vector_base<Train,_std::allocator<Train>_>._M_impl.
           super__Vector_impl_data._M_start;
  local_e8 = 0;
  for (; pTVar7 != pTVar1; pTVar7 = pTVar7 + 1) {
    Train::Train(&local_80,pTVar7);
    uVar5 = 0;
    bVar9 = false;
    for (uVar6 = 0; uVar6 < this->maxTimeSteps; uVar6 = uVar6 + 1) {
      if (local_80.start.arrivalTime <= uVar6 && !bVar9) {
        uVar5 = uVar5 + 1;
        bVar9 = false;
        ppEVar2 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        for (ppEVar8 = (this->graph).edges.super__Vector_base<Edge_*,_std::allocator<Edge_*>_>.
                       _M_impl.super__Vector_impl_data._M_start; ppEVar8 != ppEVar2;
            ppEVar8 = ppEVar8 + 1) {
          pEVar3 = *ppEVar8;
          z3::ast_vector_tpl<z3::expr>::operator[]
                    ((ast_vector_tpl<z3::expr> *)&local_a0,
                     (int)(this->occupiedVars).
                          super__Vector_base<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>,_std::allocator<std::vector<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[local_80.id].
                          super__Vector_base<z3::ast_vector_tpl<z3::expr>,_std::allocator<z3::ast_vector_tpl<z3::expr>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + (int)(uVar6 << 4));
          z3::model::eval((model *)&local_90,(expr *)&local_b0,SUB81(&local_a0,0));
          ZVar4 = z3::expr::bool_value((expr *)&local_90);
          z3::ast::~ast(&local_90);
          z3::ast::~ast(&local_a0);
          if (ZVar4 == Z3_L_TRUE) {
            bVar9 = pEVar3 == local_80.stops.super__Vector_base<Stop,_std::allocator<Stop>_>._M_impl
                              .super__Vector_impl_data._M_finish[-1].stopEdge;
          }
        }
      }
    }
    if (local_e8 < uVar5) {
      local_e8 = uVar5;
    }
    Train::~Train(&local_80);
  }
  z3::model::~model(&local_b0);
  return local_e8;
}

Assistant:

uint32_t Instance::makespan() {
  model m = solver.get_model();
  uint32_t make_span = 0;
  for (Train train : trains) {
    uint32_t travel_time = 0;
    bool reachedGoal = false;
    for (size_t time = 0; time < maxTimeSteps; time++) {
      if(time < train.start.arrivalTime || reachedGoal){
        continue;
      }
      travel_time++;
      for (Edge *edge : graph.edges) {
        if (m.eval(occupiedVars[train.id][time][edge->id], false)
                .bool_value() == Z3_TRUE) {
          reachedGoal = edge == train.stops.back().stopEdge;
        }
      }
    }
    if(travel_time > make_span)
      make_span = travel_time;
  }
  return make_span;
}